

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

int __thiscall ON_String::ReverseFind(ON_String *this,char *s)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ON_Internal_Empty_aString *pOVar6;
  ulong uVar7;
  char *unaff_R14;
  size_t __n;
  bool bVar8;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    pcVar2 = this->m_s;
    pOVar6 = &empty_astring;
    if (pcVar2 != (char *)0x0) {
      pOVar6 = (ON_Internal_Empty_aString *)(pcVar2 + -0xc);
    }
    uVar1 = (pOVar6->header).string_length;
    if (0 < (int)uVar1) {
      __n = 0xffffffffffffffff;
      do {
        lVar3 = __n + 1;
        __n = __n + 1;
      } while (s[lVar3] != '\0');
      if ((int)uVar1 < (int)__n) {
        bVar8 = true;
      }
      else {
        uVar5 = uVar1 - __n;
        uVar7 = uVar5 >> 0x1f & 1;
        bVar8 = SUB81(uVar7,0);
        if (-1 < (int)uVar5) {
          unaff_R14 = pcVar2 + (uVar5 & 0xffffffff);
          do {
            bVar8 = SUB81(uVar7,0);
            iVar4 = strncmp(unaff_R14,s,__n);
            if (iVar4 == 0) {
              iVar4 = (int)unaff_R14 - (int)pcVar2;
              goto LAB_005c1bf2;
            }
            unaff_R14 = unaff_R14 + -1;
            bVar8 = unaff_R14 < pcVar2;
            uVar7 = (ulong)bVar8;
          } while (!bVar8);
        }
      }
      iVar4 = (int)unaff_R14;
LAB_005c1bf2:
      if (bVar8 == false) {
        return iVar4;
      }
    }
  }
  return -1;
}

Assistant:

int ON_String::ReverseFind(const char* s) const
{
  int rc = -1;
  if (s && s[0] && !IsEmpty()) 
  {
    int s_len = 0;
    while (0 != s[s_len])
      s_len++;
    if (Length() >= s_len)
    {
      const char* p0 = m_s;
      const char* p = p0 + (Length()-s_len);
      while (p >= p0)
      {
        if (0 == strncmp(p, s, s_len))
          return ((int)(p - p0));
        p--;
      }
    }
  }
  return rc;
}